

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<unsigned_long> __thiscall kj::anon_unknown_77::TeeBranch::tryGetLength(TeeBranch *this)

{
  long lVar1;
  long lVar2;
  uint64_t uVar3;
  long lVar4;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  long in_RSI;
  bool bVar5;
  Maybe<unsigned_long> MVar6;
  Fault FStack_18;
  
  lVar1 = *(long *)(in_RSI + 0x10);
  lVar4 = (ulong)*(byte *)(in_RSI + 0x18) * 0x60;
  if (*(char *)(lVar1 + 0x38 + lVar4) == '\0') {
    kj::_::Debug::Fault::Fault
              (&FStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x4ee,FAILED,"branches[branch] != nullptr","");
    kj::_::Debug::Fault::fatal(&FStack_18);
  }
  bVar5 = *(char *)(lVar1 + 0x28) == '\x01';
  if (bVar5) {
    lVar2 = *(long *)(lVar1 + 0x30);
    uVar3 = AsyncTee::Buffer::size((Buffer *)(lVar1 + lVar4 + 0x40));
    (this->tee).disposer = (Disposer *)(uVar3 + lVar2);
    in_RDX = extraout_RDX;
  }
  *(bool *)&(this->super_AsyncInputStream)._vptr_AsyncInputStream = bVar5;
  MVar6.ptr.field_1.value = in_RDX.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

KJ_IF_MAYBE(s, state) {
      s->abortRead();
    }